

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O2

void benchmark::anon_unknown_1::InitializeSystemInfo(void)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  ssize_t sVar8;
  long lVar9;
  int64_t iVar10;
  double dVar11;
  char *err;
  long local_468;
  ulong local_460;
  ulong local_458;
  double local_450;
  long freq;
  CheckHandler local_440;
  char line [1024];
  
  bVar3 = ReadIntFromFile("/sys/devices/system/cpu/cpu0/tsc_freq_khz",&freq);
  if ((bVar3) ||
     (bVar3 = ReadIntFromFile("/sys/devices/system/cpu/cpu0/cpufreq/cpuinfo_max_freq",&freq), bVar3)
     ) {
    (anonymous_namespace)::cpuinfo_cycles_per_second = (double)freq * 1000.0;
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  iVar4 = open("/proc/cpuinfo",0);
  if (iVar4 == -1) {
    perror("/proc/cpuinfo");
    iVar4 = (anonymous_namespace)::cpuinfo_num_cpus;
    if (!bVar3) {
      iVar10 = EstimateCyclesPerSecond();
      (anonymous_namespace)::cpuinfo_cycles_per_second = (double)iVar10;
      iVar4 = (anonymous_namespace)::cpuinfo_num_cpus;
    }
  }
  else {
    local_458 = 0;
    line[0] = '\0';
    line[1] = '\0';
    local_450 = 1.0;
    sVar8 = 0;
    local_468 = 0;
    local_460 = 0;
    do {
      sVar6 = strlen(line);
      if (sVar6 == 0x3ff) {
        line._0_2_ = line._0_2_ & 0xff00;
      }
      else {
        memmove(line,line + sVar6 + 1,0x3ff - sVar6);
      }
      pcVar7 = strchr(line,10);
      if (pcVar7 == (char *)0x0) {
        sVar6 = strlen(line);
        if (sVar6 == 0x3ff) {
          internal::CheckHandler::CheckHandler
                    (&local_440,"bytes_to_read > 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/sysinfo.cc"
                     ,"InitializeSystemInfo",0x99);
          internal::CheckHandler::~CheckHandler(&local_440);
        }
        internal::GetNullLogInstance();
        sVar8 = read(iVar4,line + sVar6,0x3ff - sVar6);
        line[sVar8 + sVar6] = '\0';
        pcVar7 = strchr(line,10);
        if (pcVar7 != (char *)0x0) goto LAB_0012bea9;
      }
      else {
LAB_0012bea9:
        *pcVar7 = '\0';
      }
      bVar1 = bVar3;
      if ((bVar3) || (iVar5 = strncasecmp(line,"cpu MHz",7), iVar5 != 0)) {
        iVar5 = strncasecmp(line,"bogomips",8);
        if (iVar5 == 0) {
          pcVar7 = strchr(line,0x3a);
          if (pcVar7 != (char *)0x0) {
            local_450 = strtod(pcVar7 + 1,&err);
            local_450 = local_450 * 1000000.0;
            if (pcVar7[1] != '\0') {
              local_460 = CONCAT71((int7)(local_460 >> 8),
                                   (byte)local_460 | (0.0 < local_450 && *err == '\0'));
            }
          }
        }
        else {
          iVar5 = bcmp(line,"processor",9);
          if (iVar5 == 0) {
            local_458 = (ulong)((int)local_458 + 1);
            pcVar7 = strchr(line,0x3a);
            if ((pcVar7 != (char *)0x0) && (lVar9 = strtol(pcVar7 + 1,&err,10), pcVar7[1] != '\0'))
            {
              if (lVar9 < local_468) {
                lVar9 = local_468;
              }
              if (*err == '\0') {
                local_468 = lVar9;
              }
            }
          }
        }
      }
      else {
        pcVar7 = strchr(line,0x3a);
        if (pcVar7 != (char *)0x0) {
          dVar11 = strtod(pcVar7 + 1,&err);
          (anonymous_namespace)::cpuinfo_cycles_per_second = dVar11 * 1000000.0;
          if (pcVar7[1] != '\0') {
            if (0.0 < (anonymous_namespace)::cpuinfo_cycles_per_second) {
              bVar1 = true;
            }
            if (*err != '\0') {
              bVar1 = bVar3;
            }
          }
        }
      }
      bVar3 = bVar1;
    } while (sVar8 != 0);
    close(iVar4);
    uVar2 = local_458;
    dVar11 = (anonymous_namespace)::cpuinfo_cycles_per_second;
    if ((!bVar1) && (dVar11 = local_450, (local_460 & 1) == 0)) {
      iVar10 = EstimateCyclesPerSecond();
      dVar11 = (double)iVar10;
    }
    (anonymous_namespace)::cpuinfo_cycles_per_second = dVar11;
    iVar4 = (int)uVar2;
    if (iVar4 == 0) {
      fwrite("Failed to read num. CPUs correctly from /proc/cpuinfo\n",0x36,1,_stderr);
      iVar4 = (anonymous_namespace)::cpuinfo_num_cpus;
    }
    else if (local_468 + 1 != (long)iVar4) {
      fwrite("CPU ID assignments in /proc/cpuinfo seem messed up. This is usually caused by a bad BIOS.\n"
             ,0x5a,1,_stderr);
    }
  }
  (anonymous_namespace)::cpuinfo_num_cpus = iVar4;
  return;
}

Assistant:

void InitializeSystemInfo() {
#if defined BENCHMARK_OS_LINUX || defined BENCHMARK_OS_CYGWIN
  char line[1024];
  char* err;
  long freq;

  bool saw_mhz = false;

  // If the kernel is exporting the tsc frequency use that. There are issues
  // where cpuinfo_max_freq cannot be relied on because the BIOS may be
  // exporintg an invalid p-state (on x86) or p-states may be used to put the
  // processor in a new mode (turbo mode). Essentially, those frequencies
  // cannot always be relied upon. The same reasons apply to /proc/cpuinfo as
  // well.
  if (!saw_mhz &&
      ReadIntFromFile("/sys/devices/system/cpu/cpu0/tsc_freq_khz", &freq)) {
    // The value is in kHz (as the file name suggests).  For example, on a
    // 2GHz warpstation, the file contains the value "2000000".
    cpuinfo_cycles_per_second = freq * 1000.0;
    saw_mhz = true;
  }

  // If CPU scaling is in effect, we want to use the *maximum* frequency,
  // not whatever CPU speed some random processor happens to be using now.
  if (!saw_mhz &&
      ReadIntFromFile("/sys/devices/system/cpu/cpu0/cpufreq/cpuinfo_max_freq",
                      &freq)) {
    // The value is in kHz.  For example, on a 2GHz warpstation, the file
    // contains the value "2000000".
    cpuinfo_cycles_per_second = freq * 1000.0;
    saw_mhz = true;
  }

  // Read /proc/cpuinfo for other values, and if there is no cpuinfo_max_freq.
  const char* pname = "/proc/cpuinfo";
  int fd = open(pname, O_RDONLY);
  if (fd == -1) {
    perror(pname);
    if (!saw_mhz) {
      cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
    }
    return;
  }

  double bogo_clock = 1.0;
  bool saw_bogo = false;
  long max_cpu_id = 0;
  int num_cpus = 0;
  line[0] = line[1] = '\0';
  size_t chars_read = 0;
  do {  // we'll exit when the last read didn't read anything
    // Move the next line to the beginning of the buffer
    const size_t oldlinelen = strlen(line);
    if (sizeof(line) == oldlinelen + 1)  // oldlinelen took up entire line
      line[0] = '\0';
    else  // still other lines left to save
      memmove(line, line + oldlinelen + 1, sizeof(line) - (oldlinelen + 1));
    // Terminate the new line, reading more if we can't find the newline
    char* newline = strchr(line, '\n');
    if (newline == nullptr) {
      const size_t linelen = strlen(line);
      const size_t bytes_to_read = sizeof(line) - 1 - linelen;
      CHECK(bytes_to_read > 0);  // because the memmove recovered >=1 bytes
      chars_read = read(fd, line + linelen, bytes_to_read);
      line[linelen + chars_read] = '\0';
      newline = strchr(line, '\n');
    }
    if (newline != nullptr) *newline = '\0';

    // When parsing the "cpu MHz" and "bogomips" (fallback) entries, we only
    // accept postive values. Some environments (virtual machines) report zero,
    // which would cause infinite looping in WallTime_Init.
    if (!saw_mhz && strncasecmp(line, "cpu MHz", sizeof("cpu MHz") - 1) == 0) {
      const char* freqstr = strchr(line, ':');
      if (freqstr) {
        cpuinfo_cycles_per_second = strtod(freqstr + 1, &err) * 1000000.0;
        if (freqstr[1] != '\0' && *err == '\0' && cpuinfo_cycles_per_second > 0)
          saw_mhz = true;
      }
    } else if (strncasecmp(line, "bogomips", sizeof("bogomips") - 1) == 0) {
      const char* freqstr = strchr(line, ':');
      if (freqstr) {
        bogo_clock = strtod(freqstr + 1, &err) * 1000000.0;
        if (freqstr[1] != '\0' && *err == '\0' && bogo_clock > 0)
          saw_bogo = true;
      }
    } else if (strncmp(line, "processor", sizeof("processor") - 1) == 0) {
      // The above comparison is case-sensitive because ARM kernels often
      // include a "Processor" line that tells you about the CPU, distinct
      // from the usual "processor" lines that give you CPU ids. No current
      // Linux architecture is using "Processor" for CPU ids.
      num_cpus++;  // count up every time we see an "processor :" entry
      const char* id_str = strchr(line, ':');
      if (id_str) {
        const long cpu_id = strtol(id_str + 1, &err, 10);
        if (id_str[1] != '\0' && *err == '\0' && max_cpu_id < cpu_id)
          max_cpu_id = cpu_id;
      }
    }
  } while (chars_read > 0);
  close(fd);

  if (!saw_mhz) {
    if (saw_bogo) {
      // If we didn't find anything better, we'll use bogomips, but
      // we're not happy about it.
      cpuinfo_cycles_per_second = bogo_clock;
    } else {
      // If we don't even have bogomips, we'll use the slow estimation.
      cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
    }
  }
  if (num_cpus == 0) {
    fprintf(stderr, "Failed to read num. CPUs correctly from /proc/cpuinfo\n");
  } else {
    if ((max_cpu_id + 1) != num_cpus) {
      fprintf(stderr,
              "CPU ID assignments in /proc/cpuinfo seem messed up."
              " This is usually caused by a bad BIOS.\n");
    }
    cpuinfo_num_cpus = num_cpus;
  }

#elif defined BENCHMARK_OS_FREEBSD
// For this sysctl to work, the machine must be configured without
// SMP, APIC, or APM support.  hz should be 64-bit in freebsd 7.0
// and later.  Before that, it's a 32-bit quantity (and gives the
// wrong answer on machines faster than 2^32 Hz).  See
//  http://lists.freebsd.org/pipermail/freebsd-i386/2004-November/001846.html
// But also compare FreeBSD 7.0:
//  http://fxr.watson.org/fxr/source/i386/i386/tsc.c?v=RELENG70#L223
//  231         error = sysctl_handle_quad(oidp, &freq, 0, req);
// To FreeBSD 6.3 (it's the same in 6-STABLE):
//  http://fxr.watson.org/fxr/source/i386/i386/tsc.c?v=RELENG6#L131
//  139         error = sysctl_handle_int(oidp, &freq, sizeof(freq), req);
#if __FreeBSD__ >= 7
  uint64_t hz = 0;
#else
  unsigned int hz = 0;
#endif
  size_t sz = sizeof(hz);
  const char* sysctl_path = "machdep.tsc_freq";
  if (sysctlbyname(sysctl_path, &hz, &sz, nullptr, 0) != 0) {
    fprintf(stderr, "Unable to determine clock rate from sysctl: %s: %s\n",
            sysctl_path, strerror(errno));
    cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
  } else {
    cpuinfo_cycles_per_second = hz;
  }
// TODO: also figure out cpuinfo_num_cpus


#elif defined BENCHMARK_OS_WINDOWS
  // In NT, read MHz from the registry. If we fail to do so or we're in win9x
  // then make a crude estimate.
  DWORD data, data_size = sizeof(data);
  if (IsWindowsXPOrGreater() &&
      SUCCEEDED(
          SHGetValueA(HKEY_LOCAL_MACHINE,
                      "HARDWARE\\DESCRIPTION\\System\\CentralProcessor\\0",
                      "~MHz", nullptr, &data, &data_size)))
    cpuinfo_cycles_per_second = static_cast<double>((int64_t)data * (int64_t)(1000 * 1000));  // was mhz
  else
    cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());

  SYSTEM_INFO sysinfo;
  // Use memset as opposed to = {} to avoid GCC missing initializer false positives.
  std::memset(&sysinfo, 0, sizeof(SYSTEM_INFO));
  GetSystemInfo(&sysinfo);
  cpuinfo_num_cpus = sysinfo.dwNumberOfProcessors; // number of logical processors in the current group

#elif defined BENCHMARK_OS_MACOSX
  // returning "mach time units" per second. the current number of elapsed
  // mach time units can be found by calling uint64 mach_absolute_time();
  // while not as precise as actual CPU cycles, it is accurate in the face
  // of CPU frequency scaling and multi-cpu/core machines.
  // Our mac users have these types of machines, and accuracy
  // (i.e. correctness) trumps precision.
  // See cycleclock.h: CycleClock::Now(), which returns number of mach time
  // units on Mac OS X.
  mach_timebase_info_data_t timebase_info;
  mach_timebase_info(&timebase_info);
  double mach_time_units_per_nanosecond =
      static_cast<double>(timebase_info.denom) /
      static_cast<double>(timebase_info.numer);
  cpuinfo_cycles_per_second = mach_time_units_per_nanosecond * 1e9;

  int num_cpus = 0;
  size_t size = sizeof(num_cpus);
  int numcpus_name[] = {CTL_HW, HW_NCPU};
  if (::sysctl(numcpus_name, arraysize(numcpus_name), &num_cpus, &size, nullptr, 0) ==
          0 &&
      (size == sizeof(num_cpus)))
    cpuinfo_num_cpus = num_cpus;

#else
  // Generic cycles per second counter
  cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
#endif
}